

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astLiteralNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t tuple;
  sysbvm_tuple_t sVar1;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  tuple = *arguments;
  if (*(long *)(tuple + 0x20) == 0) {
    tuple = sysbvm_context_shallowCopy(context,tuple);
    sVar1 = sysbvm_tuple_getType(context,*(sysbvm_tuple_t *)(tuple + 0x28));
    *(sysbvm_tuple_t *)(tuple + 0x20) = sVar1;
  }
  return tuple;
}

Assistant:

static sysbvm_tuple_t sysbvm_astLiteralNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_astLiteralNode_t *literalNode = (sysbvm_astLiteralNode_t *)arguments[0];
    //sysbvm_tuple_t *environment = &arguments[1];

    if(literalNode->super.analyzedType)
        return (sysbvm_tuple_t)literalNode;

    sysbvm_astLiteralNode_t *analyzedNode = (sysbvm_astLiteralNode_t*)sysbvm_context_shallowCopy(context, (sysbvm_tuple_t)literalNode);
    analyzedNode->super.analyzedType = sysbvm_tuple_getType(context, analyzedNode->value);
    return (sysbvm_tuple_t)analyzedNode;
}